

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O0

Expression __thiscall
dynet::NaryTreeLSTMBuilder::add_input
          (NaryTreeLSTMBuilder *this,int id,vector<int,_std::allocator<int>_> *children,
          Expression *x)

{
  initializer_list<dynet::Expression> __l;
  initializer_list<dynet::Expression> __l_00;
  initializer_list<dynet::Expression> __l_01;
  initializer_list<dynet::Expression> __l_02;
  uint uVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  reference pvVar5;
  reference piVar6;
  reference pvVar7;
  const_reference pvVar8;
  ulong uVar9;
  size_type extraout_RAX;
  undefined8 *in_RCX;
  vector<int,_std::allocator<int>_> *in_RDX;
  Expression *extraout_RDX;
  long in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar10;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar11;
  undefined4 extraout_XMM0_Db_01;
  Expression EVar12;
  Expression EVar13;
  Expression EVar14;
  Expression EVar15;
  Expression ph_t;
  Expression i_ot;
  uint ej_3;
  uint j_4;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> xs_3;
  Expression i_aot;
  Expression i_crt;
  uint j_3;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> i_crts;
  Expression i_nwt;
  Expression i_wt;
  uint ej_2;
  uint j_2;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> xs_2;
  Expression i_awt;
  uint ej_1;
  uint j_1;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> xs_1;
  Expression i_aft;
  uint ek;
  uint k;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> i_ft;
  Expression i_it;
  uint ej;
  uint j;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> xs;
  Expression i_ait;
  int child;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  bool has_prev_state;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> i_c_children;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> i_h_children;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *vars;
  uint i;
  Expression in;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *ct;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *ht;
  undefined4 in_stack_fffffffffffff738;
  real in_stack_fffffffffffff73c;
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  *in_stack_fffffffffffff740;
  ComputationGraph *in_stack_fffffffffffff748;
  Expression *in_stack_fffffffffffff750;
  size_type in_stack_fffffffffffff758;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> *in_stack_fffffffffffff760;
  ComputationGraph *in_stack_fffffffffffff768;
  undefined8 in_stack_fffffffffffff770;
  ComputationGraph *in_stack_fffffffffffff778;
  size_type in_stack_fffffffffffff780;
  ComputationGraph *in_stack_fffffffffffff798;
  Expression *in_stack_fffffffffffff7a0;
  uint local_84c;
  uint local_784;
  uint local_70c;
  uint local_6f4;
  uint local_694;
  byte local_669;
  ComputationGraph *local_5e8;
  undefined8 uStack_5e0;
  ComputationGraph *local_5d8;
  undefined8 uStack_5d0;
  ComputationGraph *local_5c8;
  undefined8 uStack_5c0;
  ComputationGraph **local_5b8;
  undefined8 local_5b0;
  Expression local_5a8;
  Expression local_598;
  ComputationGraph *local_588;
  undefined8 local_580;
  Expression local_578;
  uint local_564;
  uint local_560;
  ComputationGraph *local_558;
  undefined8 uStack_550;
  ComputationGraph *local_548;
  undefined8 uStack_540;
  ComputationGraph *local_538;
  undefined8 uStack_530;
  ComputationGraph **local_520;
  undefined8 local_518;
  Expression local_4f8;
  value_type local_4e8;
  value_type local_4d8;
  Expression local_4c8;
  value_type local_4b8;
  uint local_4a8;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_4a0;
  Expression local_488;
  ComputationGraph *local_468;
  undefined8 uStack_460;
  ComputationGraph *local_458;
  undefined8 uStack_450;
  ComputationGraph *local_448;
  undefined8 uStack_440;
  ComputationGraph **local_438;
  undefined8 local_430;
  Expression local_428;
  Expression local_418;
  Expression local_408;
  uint local_3f4;
  uint local_3f0;
  ComputationGraph *local_3e8;
  undefined8 uStack_3e0;
  ComputationGraph *local_3d8;
  undefined8 uStack_3d0;
  ComputationGraph *local_3c8;
  undefined8 uStack_3c0;
  ComputationGraph **local_3b0;
  undefined8 local_3a8;
  Expression local_388;
  Expression local_378;
  Expression local_368;
  ComputationGraph *local_358;
  undefined8 uStack_350;
  ComputationGraph *local_348;
  undefined8 uStack_340;
  ComputationGraph *local_338;
  undefined8 uStack_330;
  ComputationGraph **local_328;
  undefined8 local_320;
  Expression local_318;
  Expression local_308;
  Expression local_2f8;
  Expression local_2e8;
  uint local_2d4;
  uint local_2d0;
  ComputationGraph *local_2c8;
  undefined8 uStack_2c0;
  ComputationGraph *local_2b8;
  undefined8 uStack_2b0;
  ComputationGraph *local_2a8;
  undefined8 uStack_2a0;
  ComputationGraph **local_290;
  undefined8 local_288;
  Expression local_268;
  uint local_258;
  uint local_254;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_250;
  Expression local_238;
  ComputationGraph *local_228;
  undefined8 uStack_220;
  ComputationGraph *local_218;
  undefined8 uStack_210;
  ComputationGraph *local_208;
  undefined8 uStack_200;
  ComputationGraph **local_1f8;
  undefined8 local_1f0;
  Expression local_1e8;
  Expression local_1d8;
  Expression local_1c8;
  Expression local_1b8;
  uint local_1a4;
  uint local_1a0;
  ComputationGraph *local_198;
  undefined8 uStack_190;
  ComputationGraph *local_188;
  undefined8 uStack_180;
  ComputationGraph *local_178;
  undefined8 uStack_170;
  ComputationGraph **local_168;
  undefined8 local_160;
  Expression local_140;
  int local_12c;
  int *local_128;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_120 [2];
  Expression local_110;
  Expression local_100;
  byte local_e9;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_e8;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> local_d0;
  reference local_b8;
  uint local_ac;
  ComputationGraph *local_a8;
  undefined8 uStack_a0;
  reference local_98;
  reference local_90;
  undefined8 *local_38;
  
  local_38 = in_RCX;
  std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0xdc30a3);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            (in_stack_fffffffffffff760,in_stack_fffffffffffff758,
             (allocator_type *)in_stack_fffffffffffff750);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::push_back(in_stack_fffffffffffff740,
              (value_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
             in_stack_fffffffffffff750);
  std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0xdc30f3);
  std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0xdc3130);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            (in_stack_fffffffffffff760,in_stack_fffffffffffff758,
             (allocator_type *)in_stack_fffffffffffff750);
  std::
  vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
  ::push_back(in_stack_fffffffffffff740,
              (value_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
             in_stack_fffffffffffff750);
  std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0xdc3180);
  local_90 = std::
             vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ::back(in_stack_fffffffffffff740);
  local_98 = std::
             vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ::back(in_stack_fffffffffffff740);
  EVar14.i = (int)in_stack_fffffffffffff770;
  EVar14.graph_id = (int)((ulong)in_stack_fffffffffffff770 >> 0x20);
  EVar14.pg = in_stack_fffffffffffff778;
  EVar15._8_8_ = in_stack_fffffffffffff760;
  EVar15.pg = in_stack_fffffffffffff768;
  EVar13._8_8_ = in_stack_fffffffffffff740;
  EVar13.pg = in_stack_fffffffffffff748;
  local_a8 = (ComputationGraph *)*local_38;
  uStack_a0 = local_38[1];
  for (local_ac = 0; local_ac < *(uint *)(in_RDI + 0x198); local_ac = local_ac + 1) {
    local_b8 = std::
               vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
               ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                             *)(in_RDI + 0x100),(ulong)local_ac);
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0xdc322f);
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0xdc323c);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
    if (1 < sVar3) {
      std::vector<int,_std::allocator<int>_>::size(in_RDX);
    }
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
              (EVar14._8_8_,(size_type)EVar15.pg);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
    if (1 < sVar3) {
      std::vector<int,_std::allocator<int>_>::size(in_RDX);
    }
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
              (EVar14._8_8_,(size_type)EVar15.pg);
    sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
    local_669 = 1;
    if (sVar3 == 0) {
      local_669 = *(byte *)(in_RDI + 0x160);
    }
    local_e9 = local_669 & 1;
    sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
    if (sVar3 == 0) {
      Expression::Expression(&local_100);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                (EVar13._8_8_,
                 (value_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      Expression::Expression(&local_110);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                (EVar13._8_8_,
                 (value_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      if ((*(byte *)(in_RDI + 0x160) & 1) != 0) {
        pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                            (in_RDI + 0x168),(ulong)local_ac);
        pvVar5 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (&local_d0,0);
        pvVar5->pg = pvVar4->pg;
        uVar1 = pvVar4->graph_id;
        pvVar5->i = pvVar4->i;
        pvVar5->graph_id = uVar1;
        pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                            (in_RDI + 0x180),(ulong)local_ac);
        pvVar5 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (&local_e8,0);
        pvVar5->pg = pvVar4->pg;
        uVar1 = pvVar4->graph_id;
        pvVar5->i = pvVar4->i;
        pvVar5->graph_id = uVar1;
      }
    }
    else {
      local_120[0]._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)
                             CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      local_128 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          (EVar13._8_8_,
                           (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                           CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
        if (!bVar2) break;
        piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*(local_120);
        local_12c = *piVar6;
        pvVar7 = std::
                 vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                 ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                               *)(in_RDI + 0x130),(long)local_12c);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                  (pvVar7,(ulong)local_ac);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                   in_stack_fffffffffffff750,(value_type *)EVar13.pg);
        pvVar7 = std::
                 vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                 ::operator[]((vector<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                               *)(in_RDI + 0x148),(long)local_12c);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                  (pvVar7,(ulong)local_ac);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                   in_stack_fffffffffffff750,(value_type *)EVar13.pg);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (local_120);
      }
    }
    Expression::Expression(&local_140);
    if ((local_e9 & 1) == 0) {
      pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b8,1);
      local_228 = pvVar8->pg;
      uStack_220._0_4_ = pvVar8->i;
      uStack_220._4_4_ = pvVar8->graph_id;
      pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b8,0);
      local_218 = pvVar8->pg;
      uStack_210._0_4_ = pvVar8->i;
      uStack_210._4_4_ = pvVar8->graph_id;
      local_208 = local_a8;
      uStack_200 = uStack_a0;
      local_1f8 = &local_228;
      local_1f0 = 3;
      EVar12 = affine_transform((initializer_list<dynet::Expression> *)0xdc39c4);
      local_1e8 = EVar12;
    }
    else {
      pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b8,1);
      local_198 = pvVar8->pg;
      uStack_190._0_4_ = pvVar8->i;
      uStack_190._4_4_ = pvVar8->graph_id;
      pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b8,0);
      local_188 = pvVar8->pg;
      uStack_180._0_4_ = pvVar8->i;
      uStack_180._4_4_ = pvVar8->graph_id;
      local_178 = local_a8;
      uStack_170 = uStack_a0;
      local_168 = &local_198;
      local_160 = 3;
      std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0xdc367e);
      __l._M_len = in_stack_fffffffffffff780;
      __l._M_array = (iterator)EVar14.pg;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                (EVar14._8_8_,__l,(allocator_type *)EVar15.pg);
      std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0xdc36b2);
      std::vector<int,_std::allocator<int>_>::size(in_RDX);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                (EVar14._8_8_,(size_type)EVar15.pg);
      local_1a0 = 0;
      while( true ) {
        uVar9 = (ulong)local_1a0;
        sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
        if (sVar3 <= uVar9) break;
        if (local_1a0 < *(uint *)(in_RDI + 0x19c)) {
          local_694 = local_1a0;
        }
        else {
          local_694 = *(int *)(in_RDI + 0x19c) - 1;
        }
        local_1a4 = local_694;
        EVar12 = Lookup((NaryTreeLSTMBuilder *)EVar15.pg,EVar15.graph_id,EVar15.i,
                        (uint)(in_stack_fffffffffffff758 >> 0x20));
        local_1b8 = EVar12;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  (EVar13._8_8_,
                   (value_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                  (&local_d0,(ulong)local_1a0);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                   in_stack_fffffffffffff750,(value_type *)EVar13.pg);
        EVar12 = Lookup((NaryTreeLSTMBuilder *)EVar15.pg,EVar15.graph_id,EVar15.i,
                        (uint)(in_stack_fffffffffffff758 >> 0x20));
        local_1c8 = EVar12;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  (EVar13._8_8_,
                   (value_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                  (&local_e8,(ulong)local_1a0);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                   in_stack_fffffffffffff750,(value_type *)EVar13.pg);
        local_1a0 = local_1a0 + 1;
      }
      EVar12 = affine_transform<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                         ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0xdc38ee)
      ;
      local_1d8 = EVar12;
      local_140 = EVar12;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
                ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                 in_stack_fffffffffffff750);
      EVar12 = local_140;
    }
    local_140 = EVar12;
    EVar12 = logistic(in_stack_fffffffffffff750);
    local_238 = EVar12;
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0xdc3a62);
    local_254 = 0;
    while( true ) {
      uVar9 = (ulong)local_254;
      sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
      if (sVar3 <= uVar9) break;
      if (local_254 < *(uint *)(in_RDI + 0x19c)) {
        local_6f4 = local_254;
      }
      else {
        local_6f4 = *(int *)(in_RDI + 0x19c) - 1;
      }
      local_258 = local_6f4;
      Expression::Expression(&local_268);
      if ((local_e9 & 1) == 0) {
        pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (local_b8,3);
        local_358 = pvVar8->pg;
        uStack_350._0_4_ = pvVar8->i;
        uStack_350._4_4_ = pvVar8->graph_id;
        pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (local_b8,2);
        local_348 = pvVar8->pg;
        uStack_340._0_4_ = pvVar8->i;
        uStack_340._4_4_ = pvVar8->graph_id;
        local_338 = local_a8;
        uStack_330 = uStack_a0;
        local_328 = &local_358;
        local_320 = 3;
        EVar12 = affine_transform((initializer_list<dynet::Expression> *)0xdc3f09);
        local_318 = EVar12;
      }
      else {
        pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (local_b8,3);
        local_2c8 = pvVar8->pg;
        uStack_2c0._0_4_ = pvVar8->i;
        uStack_2c0._4_4_ = pvVar8->graph_id;
        pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (local_b8,2);
        local_2b8 = pvVar8->pg;
        uStack_2b0._0_4_ = pvVar8->i;
        uStack_2b0._4_4_ = pvVar8->graph_id;
        local_2a8 = local_a8;
        uStack_2a0 = uStack_a0;
        local_290 = &local_2c8;
        local_288 = 3;
        std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0xdc3b82);
        __l_00._M_len = in_stack_fffffffffffff780;
        __l_00._M_array = (iterator)EVar14.pg;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                  (EVar14._8_8_,__l_00,(allocator_type *)EVar15.pg);
        std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0xdc3bb6);
        std::vector<int,_std::allocator<int>_>::size(in_RDX);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                  (EVar14._8_8_,(size_type)EVar15.pg);
        local_2d0 = 0;
        while( true ) {
          uVar9 = (ulong)local_2d0;
          sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
          if (sVar3 <= uVar9) break;
          if (local_2d0 < *(uint *)(in_RDI + 0x19c)) {
            local_70c = local_2d0;
          }
          else {
            local_70c = *(int *)(in_RDI + 0x19c) - 1;
          }
          local_2d4 = local_70c;
          EVar12 = Lookup((NaryTreeLSTMBuilder *)EVar15.pg,EVar15.graph_id,EVar15.i,
                          (uint)(in_stack_fffffffffffff758 >> 0x20));
          local_2e8 = EVar12;
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                    (EVar13._8_8_,
                     (value_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                    (&local_d0,(ulong)local_2d0);
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                    ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                     in_stack_fffffffffffff750,(value_type *)EVar13.pg);
          EVar12 = Lookup((NaryTreeLSTMBuilder *)EVar15.pg,EVar15.graph_id,EVar15.i,
                          (uint)(in_stack_fffffffffffff758 >> 0x20));
          local_2f8 = EVar12;
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                    (EVar13._8_8_,
                     (value_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                    (&local_e8,(ulong)local_2d0);
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                    ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                     in_stack_fffffffffffff750,(value_type *)EVar13.pg);
          local_2d0 = local_2d0 + 1;
        }
        EVar12 = affine_transform<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                           ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                            0xdc3e32);
        local_308 = EVar12;
        local_268 = EVar12;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                   in_stack_fffffffffffff750);
        EVar12 = local_268;
      }
      local_268 = EVar12;
      EVar12 = dynet::operator+(EVar13._8_8_,in_stack_fffffffffffff73c);
      local_378 = EVar12;
      EVar12 = logistic(in_stack_fffffffffffff750);
      local_368 = EVar12;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                (EVar13._8_8_,
                 (value_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
      local_254 = local_254 + 1;
    }
    Expression::Expression(&local_388);
    if ((local_e9 & 1) == 0) {
      pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b8,7);
      local_468 = pvVar8->pg;
      uStack_460._0_4_ = pvVar8->i;
      uStack_460._4_4_ = pvVar8->graph_id;
      pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b8,6);
      local_458 = pvVar8->pg;
      uStack_450._0_4_ = pvVar8->i;
      uStack_450._4_4_ = pvVar8->graph_id;
      local_448 = local_a8;
      uStack_440 = uStack_a0;
      local_438 = &local_468;
      local_430 = 3;
      EVar12 = affine_transform((initializer_list<dynet::Expression> *)0xdc435e);
      uVar10 = extraout_XMM0_Da_00;
      uVar11 = extraout_XMM0_Db_00;
      local_428 = EVar12;
    }
    else {
      pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b8,7);
      local_3e8 = pvVar8->pg;
      uStack_3e0._0_4_ = pvVar8->i;
      uStack_3e0._4_4_ = pvVar8->graph_id;
      pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b8,6);
      local_3d8 = pvVar8->pg;
      uStack_3d0._0_4_ = pvVar8->i;
      uStack_3d0._4_4_ = pvVar8->graph_id;
      local_3c8 = local_a8;
      uStack_3c0 = uStack_a0;
      local_3b0 = &local_3e8;
      local_3a8 = 3;
      std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0xdc40a8);
      __l_01._M_len = in_stack_fffffffffffff780;
      __l_01._M_array = (iterator)EVar14.pg;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                (EVar14._8_8_,__l_01,(allocator_type *)EVar15.pg);
      std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0xdc40dc);
      std::vector<int,_std::allocator<int>_>::size(in_RDX);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                (EVar14._8_8_,(size_type)EVar15.pg);
      local_3f0 = 0;
      while( true ) {
        uVar9 = (ulong)local_3f0;
        sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
        if (sVar3 <= uVar9) break;
        if (local_3f0 < *(uint *)(in_RDI + 0x19c)) {
          local_784 = local_3f0;
        }
        else {
          local_784 = *(int *)(in_RDI + 0x19c) - 1;
        }
        local_3f4 = local_784;
        EVar12 = Lookup((NaryTreeLSTMBuilder *)EVar15.pg,EVar15.graph_id,EVar15.i,
                        (uint)(in_stack_fffffffffffff758 >> 0x20));
        local_408 = EVar12;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  (EVar13._8_8_,
                   (value_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                  (&local_d0,(ulong)local_3f0);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                   in_stack_fffffffffffff750,(value_type *)EVar13.pg);
        local_3f0 = local_3f0 + 1;
      }
      EVar12 = affine_transform<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                         ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0xdc4287)
      ;
      local_418 = EVar12;
      local_388 = EVar12;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
                ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                 in_stack_fffffffffffff750);
      uVar10 = extraout_XMM0_Da;
      uVar11 = extraout_XMM0_Db;
      EVar12 = local_388;
    }
    local_388 = EVar12;
    tanh((double)CONCAT44(uVar11,uVar10));
    if ((local_e9 & 1) == 0) {
      EVar12 = cmult(in_stack_fffffffffffff7a0,(Expression *)in_stack_fffffffffffff798);
      local_4e8 = EVar12;
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_98,(ulong)local_ac);
      *pvVar4 = local_4e8;
    }
    else {
      EVar12 = cmult(in_stack_fffffffffffff7a0,(Expression *)in_stack_fffffffffffff798);
      local_488 = EVar12;
      std::vector<int,_std::allocator<int>_>::size(in_RDX);
      std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0xdc446e);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                (EVar15._8_8_,in_stack_fffffffffffff758,(allocator_type *)in_stack_fffffffffffff750)
      ;
      std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0xdc449a);
      local_4a8 = 0;
      while( true ) {
        uVar9 = (ulong)local_4a8;
        sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
        if (sVar3 <= uVar9) break;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                  (&local_250,(ulong)local_4a8);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                  (&local_e8,(ulong)local_4a8);
        EVar12 = cmult(in_stack_fffffffffffff7a0,(Expression *)in_stack_fffffffffffff798);
        local_4b8 = EVar12;
        pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                           (&local_4a0,(ulong)local_4a8);
        *pvVar4 = local_4b8;
        local_4a8 = local_4a8 + 1;
      }
      EVar12 = sum<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                         ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0xdc45e7)
      ;
      local_4c8 = EVar12;
      EVar12 = dynet::operator+(in_stack_fffffffffffff7a0,(Expression *)in_stack_fffffffffffff798);
      local_4d8 = EVar12;
      pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_98,(ulong)local_ac);
      *pvVar4 = local_4d8;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
                ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                 in_stack_fffffffffffff750);
    }
    Expression::Expression(&local_4f8);
    if ((local_e9 & 1) == 0) {
      pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b8,5);
      local_5e8 = pvVar8->pg;
      uStack_5e0._0_4_ = pvVar8->i;
      uStack_5e0._4_4_ = pvVar8->graph_id;
      pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b8,4);
      local_5d8 = pvVar8->pg;
      uStack_5d0._0_4_ = pvVar8->i;
      uStack_5d0._4_4_ = pvVar8->graph_id;
      local_5c8 = local_a8;
      uStack_5c0 = uStack_a0;
      local_5b8 = &local_5e8;
      local_5b0 = 3;
      EVar14 = affine_transform((initializer_list<dynet::Expression> *)0xdc4ac5);
      local_4f8 = EVar14;
      local_5a8 = EVar14;
    }
    else {
      pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b8,5);
      local_558 = pvVar8->pg;
      uStack_550._0_4_ = pvVar8->i;
      uStack_550._4_4_ = pvVar8->graph_id;
      pvVar8 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                         (local_b8,4);
      local_548 = pvVar8->pg;
      uStack_540._0_4_ = pvVar8->i;
      uStack_540._4_4_ = pvVar8->graph_id;
      local_538 = local_a8;
      uStack_530 = uStack_a0;
      local_520 = &local_558;
      local_518 = 3;
      std::allocator<dynet::Expression>::allocator((allocator<dynet::Expression> *)0xdc47a8);
      __l_02._M_len = in_stack_fffffffffffff780;
      __l_02._M_array = (iterator)EVar14.pg;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                (EVar14._8_8_,__l_02,(allocator_type *)EVar15.pg);
      std::allocator<dynet::Expression>::~allocator((allocator<dynet::Expression> *)0xdc47dc);
      std::vector<int,_std::allocator<int>_>::size(in_RDX);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                (EVar14._8_8_,(size_type)EVar15.pg);
      local_560 = 0;
      while( true ) {
        uVar9 = (ulong)local_560;
        sVar3 = std::vector<int,_std::allocator<int>_>::size(in_RDX);
        if (sVar3 <= uVar9) break;
        if (local_560 < *(uint *)(in_RDI + 0x19c)) {
          local_84c = local_560;
        }
        else {
          local_84c = *(int *)(in_RDI + 0x19c) - 1;
        }
        local_564 = local_84c;
        EVar12 = Lookup((NaryTreeLSTMBuilder *)EVar15.pg,EVar15.graph_id,EVar15.i,
                        (uint)(in_stack_fffffffffffff758 >> 0x20));
        in_stack_fffffffffffff7a0 = EVar12._8_8_;
        local_578 = EVar12;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  (EVar13._8_8_,
                   (value_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                  (&local_d0,(ulong)local_560);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                   in_stack_fffffffffffff750,(value_type *)EVar13.pg);
        EVar12 = Lookup((NaryTreeLSTMBuilder *)EVar15.pg,EVar15.graph_id,EVar15.i,
                        (uint)(in_stack_fffffffffffff758 >> 0x20));
        local_580 = EVar12._8_8_;
        in_stack_fffffffffffff798 = EVar12.pg;
        local_588 = in_stack_fffffffffffff798;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  (EVar13._8_8_,
                   (value_type *)CONCAT44(in_stack_fffffffffffff73c,in_stack_fffffffffffff738));
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                  (&local_e8,(ulong)local_560);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                   in_stack_fffffffffffff750,(value_type *)EVar13.pg);
        local_560 = local_560 + 1;
      }
      EVar13 = affine_transform<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                         ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)0xdc49fa)
      ;
      in_stack_fffffffffffff780 = EVar13._8_8_;
      local_598 = EVar13;
      local_4f8 = EVar13;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
                ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                 in_stack_fffffffffffff750);
    }
    EVar15 = logistic(in_stack_fffffffffffff750);
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
              (local_98,(ulong)local_ac);
    tanh((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    in_stack_fffffffffffff750 = extraout_RDX;
    in_stack_fffffffffffff758 = extraout_RAX;
    EVar12 = cmult(in_stack_fffffffffffff7a0,(Expression *)in_stack_fffffffffffff798);
    EVar13 = EVar12;
    pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::operator[]
                       (local_90,(ulong)local_ac);
    pvVar4->pg = EVar12.pg;
    pvVar4->i = EVar12.i;
    pvVar4->graph_id = EVar12.graph_id;
    local_a8 = pvVar4->pg;
    uStack_a0._0_4_ = pvVar4->i;
    uStack_a0._4_4_ = pvVar4->graph_id;
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
               in_stack_fffffffffffff750);
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
               in_stack_fffffffffffff750);
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::~vector
              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
               in_stack_fffffffffffff750);
  }
  pvVar4 = std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::back(EVar13._8_8_);
  EVar12.pg = pvVar4->pg;
  EVar12.i = pvVar4->i;
  EVar12.graph_id = pvVar4->graph_id;
  return EVar12;
}

Assistant:

Expression NaryTreeLSTMBuilder::add_input(int id, vector<int> children, const Expression& x) {
  DYNET_ASSERT(id >= 0 && h.size() == (unsigned)id, "Failed dimension check in TreeLSTMBuilder");
  DYNET_ASSERT(id >= 0 && c.size() == (unsigned)id, "Failed dimension check in TreeLSTMBuilder");
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();

  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    vector<Expression> i_h_children, i_c_children;
    i_h_children.reserve(children.size() > 1 ? children.size() : 1);
    i_c_children.reserve(children.size() > 1 ? children.size() : 1);

    bool has_prev_state = (children.size() > 0 || has_initial_state);
    if (children.size() == 0) {
      i_h_children.push_back(Expression());
      i_c_children.push_back(Expression());
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_children[0] = h0[i];
        i_c_children[0] = c0[i];
      }
    }
    else {  // t > 0
      for (int child : children) {
        i_h_children.push_back(h[child][i]);
        i_c_children.push_back(c[child][i]);
      }
    }

    // input
    Expression i_ait;
    if (has_prev_state) {
      vector<Expression> xs = {vars[BI], vars[X2I], in};
      xs.reserve(4 * children.size() + 3);
      for (unsigned j = 0; j < children.size(); ++j) {
        unsigned ej = (j < N) ? j : N - 1;
        xs.push_back(Lookup(i, H2I, ej));
        xs.push_back(i_h_children[j]);
        xs.push_back(Lookup(i, C2I, ej));
        xs.push_back(i_c_children[j]);
      }
      DYNET_ASSERT(xs.size() == 4 * children.size() + 3, "Failed dimension check in TreeLSTMBuilder");
      i_ait = affine_transform(xs);
    }
    else
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    Expression i_it = logistic(i_ait);

    // forget
    vector<Expression> i_ft;
    for (unsigned k = 0; k < children.size(); ++k) {
      unsigned ek = (k < N) ? k : N - 1;
      Expression i_aft;
      if (has_prev_state) {
        vector<Expression> xs = {vars[BF], vars[X2F], in};
        xs.reserve(4 * children.size() + 3);
        for (unsigned j = 0; j < children.size(); ++j) {
          unsigned ej = (j < N) ? j : N - 1;
          xs.push_back(Lookup(i, H2F, ej * N + ek));
          xs.push_back(i_h_children[j]);
          xs.push_back(Lookup(i, C2F, ej * N + ek));
          xs.push_back(i_c_children[j]);
        }
        DYNET_ASSERT(xs.size() == 4 * children.size() + 3, "Failed dimension check in TreeLSTMBuilder");
        i_aft = affine_transform(xs);
      }
      else
        i_aft = affine_transform({vars[BF], vars[X2F], in});
      i_ft.push_back(logistic(i_aft + 1.f));
    }

    // write memory cell
    Expression i_awt;
    if (has_prev_state) {
      vector<Expression> xs = {vars[BC], vars[X2C], in};
      // This is the one and only place that should *not* condition on i_c_children
      // This should condition only on x (a.k.a. in), the bias (vars[BC]) and i_h_children
      xs.reserve(2 * children.size() + 3);
      for (unsigned j = 0; j < children.size(); ++j) {
        unsigned ej = (j < N) ? j : N - 1;
        xs.push_back(Lookup(i, H2C, ej));
        xs.push_back(i_h_children[j]);
      }
      DYNET_ASSERT(xs.size() == 2 * children.size() + 3, "Failed dimension check in TreeLSTMBuilder");
      i_awt = affine_transform(xs);
    }
    else
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);

    // compute new cell value
    if (has_prev_state) {
      Expression i_nwt = cmult(i_it, i_wt);
      vector<Expression> i_crts(children.size());
      for (unsigned j = 0; j < children.size(); ++j) {
        i_crts[j] = cmult(i_ft[j], i_c_children[j]);
      }
      Expression i_crt = sum(i_crts);
      ct[i] = i_crt + i_nwt;
    }
    else {
      ct[i] = cmult(i_it, i_wt);
    }

    // output
    Expression i_aot;
    if (has_prev_state) {
      vector<Expression> xs = {vars[BO], vars[X2O], in};
      xs.reserve(4 * children.size() + 3);
      for (unsigned j = 0; j < children.size(); ++j) {
        unsigned ej = (j < N) ? j : N - 1;
        xs.push_back(Lookup(i, H2O, ej));
        xs.push_back(i_h_children[j]);
        xs.push_back(Lookup(i, C2O, ej));
        xs.push_back(i_c_children[j]);
      }
      DYNET_ASSERT(xs.size() == 4 * children.size() + 3, "Failed dimension check in TreeLSTMBuilder");
      i_aot = affine_transform(xs);
    }
    else
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    Expression i_ot = logistic(i_aot);

    // Compute new h value
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cmult(i_ot, ph_t);
  }
  return ht.back();
}